

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_split
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unsigned_long uVar13;
  unsigned_long uVar14;
  PrimRef *pPVar15;
  int unaff_EBP;
  PrimRef *pPVar16;
  unsigned_long uVar17;
  ulong uVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  uint uVar22;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  uint uVar34;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  pair<unsigned_long,_unsigned_long> pVar43;
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  iVar9 = split->pos;
  auVar12 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)split->dim & 0x1f)) * 0x10)
  ;
  auVar11 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)split->dim & 0x1f)) * 0x10)
  ;
  pPVar6 = this->prims0;
  pPVar16 = pPVar6 + uVar4;
  pPVar15 = pPVar6 + uVar5;
  uVar14 = 0;
  uVar13 = 0;
  aVar19 = _DAT_01f7a9f0;
  aVar20 = _DAT_01f7aa00;
  aVar21 = _DAT_01f7aa00;
  aVar29 = _DAT_01f7a9f0;
  aVar30 = _DAT_01f7a9f0;
  aVar31 = _DAT_01f7aa00;
  aVar32 = _DAT_01f7a9f0;
  aVar33 = _DAT_01f7aa00;
  do {
    pPVar15 = pPVar15 + -1;
    if (pPVar16 <= pPVar15) {
      do {
        aVar1 = (pPVar16->lower).field_0.field_1;
        aVar2 = (pPVar16->upper).field_0.field_1;
        fVar39 = aVar1.x + aVar2.x;
        fVar40 = aVar1.y + aVar2.y;
        fVar41 = aVar1.z + aVar2.z;
        fVar42 = aVar1.field_3.w + aVar2.field_3.w;
        uVar22 = (uint)((fVar39 * 0.5 - (split->mapping).ofs.field_0.v[0]) *
                        (split->mapping).scale.field_0.v[0] + -0.5);
        uVar26 = (uint)((fVar40 * 0.5 - (split->mapping).ofs.field_0.v[1]) *
                        (split->mapping).scale.field_0.v[1] + -0.5);
        uVar27 = (uint)((fVar41 * 0.5 - (split->mapping).ofs.field_0.v[2]) *
                        (split->mapping).scale.field_0.v[2] + -0.5);
        uVar28 = (uint)((fVar42 * 0.5 - (split->mapping).ofs.field_0.v[3]) *
                        (split->mapping).scale.field_0.v[3] + -0.5);
        uVar34 = -(uint)(0xe < (int)uVar22);
        uVar36 = -(uint)(0xe < (int)uVar26);
        uVar37 = -(uint)(0xe < (int)uVar27);
        uVar38 = -(uint)(0xe < (int)uVar28);
        uVar22 = ~uVar34 & uVar22;
        uVar26 = ~uVar36 & uVar26;
        uVar27 = ~uVar37 & uVar27;
        uVar28 = ~uVar38 & uVar28;
        auVar23._0_4_ = -(uint)((int)(~((int)uVar22 >> 0x1f) & (uVar34 & 0xf | uVar22)) < iVar9);
        auVar23._4_4_ = -(uint)((int)(~((int)uVar26 >> 0x1f) & (uVar36 & 0xf | uVar26)) < iVar9);
        auVar23._8_4_ = -(uint)((int)(~((int)uVar27 >> 0x1f) & (uVar37 & 0xf | uVar27)) < iVar9);
        auVar23._12_4_ = -(uint)((int)(~((int)uVar28 >> 0x1f) & (uVar38 & 0xf | uVar28)) < iVar9);
        unaff_EBP = movmskps(unaff_EBP,auVar23 & auVar11);
        if (unaff_EBP == 0) break;
        aVar30.m128 = (__m128)minps(aVar30.m128,(undefined1  [16])aVar1);
        aVar31.m128 = (__m128)maxps(aVar31.m128,(undefined1  [16])aVar2);
        auVar7._4_4_ = fVar40;
        auVar7._0_4_ = fVar39;
        auVar7._8_4_ = fVar41;
        auVar7._12_4_ = fVar42;
        aVar32.m128 = (__m128)minps(aVar32.m128,auVar7);
        auVar8._4_4_ = fVar40;
        auVar8._0_4_ = fVar39;
        auVar8._8_4_ = fVar41;
        auVar8._12_4_ = fVar42;
        aVar33.m128 = (__m128)maxps(aVar33.m128,auVar8);
        uVar13 = uVar13 + (aVar1.field_3.u >> 0x1b);
        pPVar16 = pPVar16 + 1;
      } while (pPVar16 <= pPVar15);
    }
    if (pPVar15 < pPVar16) {
LAB_00c37e61:
      uVar17 = (long)pPVar16 - (long)pPVar6 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar30;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar31;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar32;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar33;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar17;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar17;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar29;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar21;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar19;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar20;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar17;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
      pVar43.second = uVar14;
      pVar43.first = uVar13;
      return pVar43;
    }
    while( true ) {
      aVar1 = (pPVar15->lower).field_0.field_1;
      aVar2 = (pPVar15->upper).field_0.field_1;
      auVar35._0_4_ = aVar1.x + aVar2.x;
      auVar35._4_4_ = aVar1.y + aVar2.y;
      auVar35._8_4_ = aVar1.z + aVar2.z;
      auVar35._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      uVar22 = (uint)((auVar35._0_4_ * 0.5 - (split->mapping).ofs.field_0.v[0]) *
                      (split->mapping).scale.field_0.v[0] + -0.5);
      uVar26 = (uint)((auVar35._4_4_ * 0.5 - (split->mapping).ofs.field_0.v[1]) *
                      (split->mapping).scale.field_0.v[1] + -0.5);
      uVar27 = (uint)((auVar35._8_4_ * 0.5 - (split->mapping).ofs.field_0.v[2]) *
                      (split->mapping).scale.field_0.v[2] + -0.5);
      uVar28 = (uint)((auVar35._12_4_ * 0.5 - (split->mapping).ofs.field_0.v[3]) *
                      (split->mapping).scale.field_0.v[3] + -0.5);
      uVar34 = -(uint)(0xe < (int)uVar22);
      uVar36 = -(uint)(0xe < (int)uVar26);
      uVar37 = -(uint)(0xe < (int)uVar27);
      uVar38 = -(uint)(0xe < (int)uVar28);
      uVar22 = ~uVar34 & uVar22;
      uVar26 = ~uVar36 & uVar26;
      uVar27 = ~uVar37 & uVar27;
      uVar28 = ~uVar38 & uVar28;
      auVar24._0_4_ = -(uint)((int)(~((int)uVar22 >> 0x1f) & (uVar34 & 0xf | uVar22)) < iVar9);
      auVar24._4_4_ = -(uint)((int)(~((int)uVar26 >> 0x1f) & (uVar36 & 0xf | uVar26)) < iVar9);
      auVar24._8_4_ = -(uint)((int)(~((int)uVar27 >> 0x1f) & (uVar37 & 0xf | uVar27)) < iVar9);
      auVar24._12_4_ = -(uint)((int)(~((int)uVar28 >> 0x1f) & (uVar38 & 0xf | uVar28)) < iVar9);
      unaff_EBP = movmskps(unaff_EBP,auVar24 & auVar12);
      uVar18 = (ulong)((uint)(pPVar15->lower).field_0.m128[3] >> 0x1b);
      if (unaff_EBP != 0) break;
      aVar29.m128 = (__m128)minps(aVar29.m128,(undefined1  [16])aVar1);
      aVar21.m128 = (__m128)maxps(aVar21.m128,(undefined1  [16])aVar2);
      aVar19.m128 = (__m128)minps(aVar19.m128,auVar35);
      aVar20.m128 = (__m128)maxps(aVar20.m128,auVar35);
      uVar14 = uVar14 + uVar18;
      pPVar15 = pPVar15 + -1;
      if (pPVar15 < pPVar16) goto LAB_00c37e61;
    }
    aVar30.m128 = (__m128)minps(aVar30.m128,(undefined1  [16])aVar1);
    aVar31.m128 = (__m128)maxps(aVar31.m128,(undefined1  [16])aVar2);
    aVar32.m128 = (__m128)minps(aVar32.m128,auVar35);
    aVar33.m128 = (__m128)maxps(aVar33.m128,auVar35);
    uVar13 = uVar13 + uVar18;
    fVar39 = (pPVar16->lower).field_0.m128[3];
    aVar2 = (pPVar16->lower).field_0.field_1;
    aVar3 = (pPVar16->upper).field_0.field_1;
    aVar29.m128 = (__m128)minps(aVar29.m128,(undefined1  [16])aVar2);
    aVar21.m128 = (__m128)maxps(aVar21.m128,(undefined1  [16])aVar3);
    (pPVar16->lower).field_0.field_1 = aVar1;
    uVar10 = *(undefined8 *)((long)&(pPVar15->upper).field_0 + 8);
    *(undefined8 *)&(pPVar16->upper).field_0 = *(undefined8 *)&(pPVar15->upper).field_0;
    *(undefined8 *)((long)&(pPVar16->upper).field_0 + 8) = uVar10;
    (pPVar15->lower).field_0.field_1 = aVar2;
    auVar25._0_4_ = aVar2.x + aVar3.x;
    auVar25._4_4_ = aVar2.y + aVar3.y;
    auVar25._8_4_ = aVar2.z + aVar3.z;
    auVar25._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar19.m128 = (__m128)minps(aVar19.m128,auVar25);
    aVar20.m128 = (__m128)maxps(aVar20.m128,auVar25);
    uVar14 = uVar14 + ((uint)fVar39 >> 0x1b);
    (pPVar15->upper).field_0.field_1 = aVar3;
    pPVar16 = pPVar16 + 1;
  } while( true );
}

Assistant:

__noinline std::pair<size_t,size_t> sequential_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS> &mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) {
                                                const Vec3fa c = ref.bounds().center();
                                                return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });

          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);
          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }